

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

StringRef llvm::yaml::ScalarTraits<llvm::yaml::Hex32,_void>::input
                    (StringRef Scalar,void *param_2,Hex32 *Val)

{
  bool bVar1;
  unsigned_long_long *in_R8;
  StringRef Str;
  uint32_t local_54;
  llvm *local_50;
  char *local_48;
  ulong local_40;
  unsigned_long_long n;
  Hex32 *Val_local;
  void *param_1_local;
  StringRef Scalar_local;
  
  Str.Data = (char *)Scalar.Length;
  local_50 = (llvm *)Scalar.Data;
  Str.Length = 0;
  local_48 = Str.Data;
  n = (unsigned_long_long)Val;
  Val_local = (Hex32 *)param_2;
  param_1_local = local_50;
  Scalar_local.Data = Str.Data;
  bVar1 = getAsUnsignedInteger(local_50,Str,(uint)&local_40,in_R8);
  if (bVar1) {
    StringRef::StringRef((StringRef *)&Scalar_local.Length,"invalid hex32 number");
  }
  else if (local_40 < 0x100000000) {
    local_54 = (uint32_t)local_40;
    Hex32::operator=((Hex32 *)n,&local_54);
    memset(&Scalar_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&Scalar_local.Length);
  }
  else {
    StringRef::StringRef((StringRef *)&Scalar_local.Length,"out of range hex32 number");
  }
  return stack0xffffffffffffffe8;
}

Assistant:

StringRef ScalarTraits<Hex32>::input(StringRef Scalar, void *, Hex32 &Val) {
  unsigned long long n;
  if (getAsUnsignedInteger(Scalar, 0, n))
    return "invalid hex32 number";
  if (n > 0xFFFFFFFFUL)
    return "out of range hex32 number";
  Val = n;
  return StringRef();
}